

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void lex_int(Lexer *lxr,int base)

{
  int *piVar1;
  ulonglong uVar2;
  Err *err_00;
  undefined1 auVar3 [16];
  Err *err;
  uint64_t value;
  char *end;
  char *start;
  Lexer *pLStack_10;
  int base_local;
  Lexer *lxr_local;
  
  if ((base != 10) && (base != 0x10)) {
    lxr->cursor = lxr->cursor + 2;
  }
  start._4_4_ = base;
  pLStack_10 = lxr;
  piVar1 = __errno_location();
  *piVar1 = 0;
  end = pLStack_10->code + pLStack_10->cursor;
  uVar2 = strtoull(end,(char **)&value,start._4_4_);
  piVar1 = __errno_location();
  if (*piVar1 == 0) {
    (pLStack_10->tk).type = 0x115;
    (pLStack_10->tk).length = (int)value - (int)end;
    auVar3._8_4_ = (int)(uVar2 >> 0x20);
    auVar3._0_8_ = uVar2;
    auVar3._12_4_ = 0x45300000;
    (pLStack_10->tk).field_4.num =
         (auVar3._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    pLStack_10->cursor = (pLStack_10->tk).length + pLStack_10->cursor;
  }
  else {
    err_00 = err_new("failed to parse number");
    err_00->line = (pLStack_10->tk).line;
    err_file(err_00,pLStack_10->path);
    err_trigger(pLStack_10->vm,err_00);
  }
  return;
}

Assistant:

static void lex_int(Lexer *lxr, int base) {
	// Skip over the prefix for every number that isn't base 10 or 16;
	// annoyingly, strtoull handles the base 16 prefix `0x` for us
	if (base != 10 && base != 16) {
		lxr->cursor += 2;
	}

	// To check for a parse error, the standard library requires us to reset
	// `errno`
	errno = 0;

	// Read the number
	char *start = &lxr->code[lxr->cursor];
	char *end;
	uint64_t value = strtoull(start, &end, base);

	// Check for a parse error
	if (errno != 0) {
		Err *err = err_new("failed to parse number");
		err->line = lxr->tk.line;
		err_file(err, lxr->path);
		err_trigger(lxr->vm, err);
		return;
	}

	lxr->tk.type = TK_NUM;
	lxr->tk.length = end - start;
	lxr->tk.num = (double) value;
	lxr->cursor += lxr->tk.length;
}